

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerOpenWal(Pager *pPager)

{
  sqlite3_vfs *psVar1;
  sqlite3_file *psVar2;
  sqlite3_filename pcVar3;
  i64 iVar4;
  int iVar5;
  uint uVar6;
  Wal *pWal;
  u8 uVar7;
  long in_FS_OFFSET;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pPager->exclusiveMode == '\0') {
    uVar7 = '\0';
  }
  else {
    iVar5 = pagerExclusiveLock(pPager);
    if (iVar5 != 0) goto LAB_0013ec22;
    uVar7 = (pPager->exclusiveMode != '\0') * '\x02';
  }
  psVar1 = pPager->pVfs;
  psVar2 = pPager->fd;
  pcVar3 = pPager->zWal;
  iVar4 = pPager->journalSizeLimit;
  pPager->pWal = (Wal *)0x0;
  pWal = (Wal *)sqlite3MallocZero((long)psVar1->szOsFile + 0x90);
  if (pWal == (Wal *)0x0) {
    iVar5 = 7;
  }
  else {
    pWal->pVfs = psVar1;
    pWal->pWalFd = (sqlite3_file *)(pWal + 1);
    pWal->pDbFd = psVar2;
    pWal->readLock = -1;
    pWal->mxWalSize = iVar4;
    pWal->zWalName = pcVar3;
    pWal->syncHeader = '\x01';
    pWal->padToSectorBoundary = '\x01';
    pWal->exclusiveMode = uVar7;
    local_3c = 0x80006;
    iVar5 = (*psVar1->xOpen)(psVar1,pcVar3,(sqlite3_file *)(pWal + 1),0x80006,(int *)&local_3c);
    if (iVar5 == 0) {
      if ((local_3c & 1) != 0) {
        pWal->readOnly = '\x01';
      }
      if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
        uVar6 = (*psVar2->pMethods->xDeviceCharacteristics)(psVar2);
        if ((uVar6 >> 10 & 1) != 0) {
          pWal->syncHeader = '\0';
        }
        if ((uVar6 >> 0xc & 1) != 0) {
          pWal->padToSectorBoundary = '\0';
        }
      }
      pPager->pWal = pWal;
      iVar5 = 0;
    }
    else {
      walIndexClose(pWal,0);
      psVar2 = pWal->pWalFd;
      if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
        (*psVar2->pMethods->xClose)(psVar2);
        psVar2->pMethods = (sqlite3_io_methods *)0x0;
      }
      sqlite3_free(pWal);
    }
  }
LAB_0013ec22:
  pagerFixMaplimit(pPager);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

static int pagerOpenWal(Pager *pPager){
  int rc = SQLITE_OK;

  assert( pPager->pWal==0 && pPager->tempFile==0 );
  assert( pPager->eLock==SHARED_LOCK || pPager->eLock==EXCLUSIVE_LOCK );

  /* If the pager is already in exclusive-mode, the WAL module will use
  ** heap-memory for the wal-index instead of the VFS shared-memory
  ** implementation. Take the exclusive lock now, before opening the WAL
  ** file, to make sure this is safe.
  */
  if( pPager->exclusiveMode ){
    rc = pagerExclusiveLock(pPager);
  }

  /* Open the connection to the log file. If this operation fails,
  ** (e.g. due to malloc() failure), return an error code.
  */
  if( rc==SQLITE_OK ){
    rc = sqlite3WalOpen(pPager->pVfs,
        pPager->fd, pPager->zWal, pPager->exclusiveMode,
        pPager->journalSizeLimit, &pPager->pWal
    );
  }
  pagerFixMaplimit(pPager);

  return rc;
}